

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

void fmt::v5::internal::sprintf_format<long_double>
               (longdouble value,buffer *buf,core_format_specs spec)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  undefined2 *puVar4;
  ulong uVar5;
  char format [10];
  char local_46;
  undefined1 local_45 [2];
  undefined1 local_43 [7];
  longdouble local_3c;
  
  local_3c = value;
  local_46 = '%';
  if (((ulong)spec >> 0x23 & 1) == 0) {
    puVar4 = (undefined2 *)local_45;
  }
  else {
    puVar4 = (undefined2 *)(local_45 + 1);
    local_45[0] = 0x23;
  }
  if (-1 < spec.precision) {
    *puVar4 = 0x2a2e;
    puVar4 = puVar4 + 1;
  }
  *(undefined1 *)puVar4 = 0x4c;
  *(char *)((long)puVar4 + 1) = spec.type;
  *(undefined1 *)(puVar4 + 1) = 0;
  do {
    uVar3 = char_traits<char>::format_float<long_double>
                      (buf->ptr_,buf->capacity_,&local_46,spec.precision,local_3c);
    if ((int)uVar3 < 0) {
      if (buf->capacity_ != 0xffffffffffffffff) {
        (**buf->_vptr_basic_buffer)(buf,buf->capacity_ + 1);
      }
LAB_00139569:
      bVar2 = false;
    }
    else {
      uVar5 = (ulong)uVar3;
      uVar1 = buf->capacity_;
      if (uVar5 < uVar1) {
        buf->size_ = uVar5;
        bVar2 = true;
      }
      else {
        bVar2 = false;
        if (uVar1 < uVar3 + 1) {
          (**buf->_vptr_basic_buffer)(buf,(ulong)(uVar3 + 1));
        }
      }
      if (uVar1 <= uVar5) goto LAB_00139569;
    }
    if (bVar2) {
      return;
    }
  } while( true );
}

Assistant:

void sprintf_format(Double value, internal::buffer &buf,
                    core_format_specs spec) {
  // Buffer capacity must be non-zero, otherwise MSVC's vsnprintf_s will fail.
  FMT_ASSERT(buf.capacity() != 0, "empty buffer");

  // Build format string.
  enum { MAX_FORMAT_SIZE = 10}; // longest format: %#-*.*Lg
  char format[MAX_FORMAT_SIZE];
  char *format_ptr = format;
  *format_ptr++ = '%';
  if (spec.has(HASH_FLAG))
    *format_ptr++ = '#';
  if (spec.precision >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }
  if (std::is_same<Double, long double>::value)
    *format_ptr++ = 'L';
  *format_ptr++ = spec.type;
  *format_ptr = '\0';

  // Format using snprintf.
  char *start = FMT_NULL;
  for (;;) {
    std::size_t buffer_size = buf.capacity();
    start = &buf[0];
    int result = internal::char_traits<char>::format_float(
        start, buffer_size, format, spec.precision, value);
    if (result >= 0) {
      unsigned n = internal::to_unsigned(result);
      if (n < buf.capacity()) {
        buf.resize(n);
        break;  // The buffer is large enough - continue with formatting.
      }
      buf.reserve(n + 1);
    } else {
      // If result is negative we ask to increase the capacity by at least 1,
      // but as std::vector, the buffer grows exponentially.
      buf.reserve(buf.capacity() + 1);
    }
  }
}